

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O3

lzma_ret lzma_raw_coder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_filter *options,
                            lzma_filter_find coder_find,_Bool is_encoder)

{
  lzma_init_function p_Var1;
  lzma_ret lVar2;
  lzma_filter_coder *plVar3;
  size_t sVar4;
  void **ppvVar5;
  size_t count;
  lzma_filter_info filters [5];
  size_t local_b0;
  lzma_filter_info local_a8 [5];
  
  lVar2 = validate_chain(options,&local_b0);
  if (lVar2 != LZMA_OK) {
    return lVar2;
  }
  if (is_encoder) {
    if (local_b0 != 0) {
      ppvVar5 = &local_a8[local_b0 - 1].options;
      sVar4 = local_b0;
      do {
        plVar3 = (*coder_find)(options->id);
        if (plVar3 == (lzma_filter_coder *)0x0) {
          return LZMA_OPTIONS_ERROR;
        }
        p_Var1 = plVar3->init;
        if (p_Var1 == (lzma_init_function)0x0) {
          return LZMA_OPTIONS_ERROR;
        }
        ((lzma_filter_info *)(ppvVar5 + -2))->id = options->id;
        ppvVar5[-1] = p_Var1;
        *ppvVar5 = options->options;
        options = options + 1;
        ppvVar5 = ppvVar5 + -3;
        sVar4 = sVar4 - 1;
      } while (sVar4 != 0);
      goto LAB_005442dd;
    }
  }
  else if (local_b0 != 0) {
    ppvVar5 = &local_a8[0].options;
    sVar4 = local_b0;
    do {
      plVar3 = (*coder_find)(options->id);
      if (plVar3 == (lzma_filter_coder *)0x0) {
        return LZMA_OPTIONS_ERROR;
      }
      p_Var1 = plVar3->init;
      if (p_Var1 == (lzma_init_function)0x0) {
        return LZMA_OPTIONS_ERROR;
      }
      ((lzma_filter_info *)(ppvVar5 + -2))->id = options->id;
      ppvVar5[-1] = p_Var1;
      *ppvVar5 = options->options;
      ppvVar5 = ppvVar5 + 3;
      options = options + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
    goto LAB_005442dd;
  }
  local_b0 = 0;
LAB_005442dd:
  local_a8[local_b0].id = 0xffffffffffffffff;
  local_a8[local_b0].init = (lzma_init_function_conflict8)0x0;
  lVar2 = lzma_next_filter_init(next,allocator,local_a8);
  if (lVar2 == LZMA_OK) {
    lVar2 = LZMA_OK;
  }
  else {
    lzma_next_end(next,allocator);
  }
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_raw_coder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter *options,
		lzma_filter_find coder_find, bool is_encoder)
{
	lzma_filter_info filters[LZMA_FILTERS_MAX + 1];
	size_t count;
	size_t i;
	lzma_ret ret;

	// Do some basic validation and get the number of filters.
	return_if_error(validate_chain(options, &count));

	// Set the filter functions and copy the options pointer.
	if (is_encoder) {
		for (i = 0; i < count; ++i) {
			// The order of the filters is reversed in the
			// encoder. It allows more efficient handling
			// of the uncompressed data.
			const size_t j = count - i - 1;

			const lzma_filter_coder *const fc
					= coder_find(options[i].id);
			if (fc == NULL || fc->init == NULL)
				return LZMA_OPTIONS_ERROR;

			filters[j].id = options[i].id;
			filters[j].init = fc->init;
			filters[j].options = options[i].options;
		}
	} else {
		for (i = 0; i < count; ++i) {
			const lzma_filter_coder *const fc
					= coder_find(options[i].id);
			if (fc == NULL || fc->init == NULL)
				return LZMA_OPTIONS_ERROR;

			filters[i].id = options[i].id;
			filters[i].init = fc->init;
			filters[i].options = options[i].options;
		}
	}

	// Terminate the array.
	filters[count].id = LZMA_VLI_UNKNOWN;
	filters[count].init = NULL;

	// Initialize the filters.
	ret = lzma_next_filter_init(next, allocator, filters);
	if (ret != LZMA_OK)
		lzma_next_end(next, allocator);

	return ret;
}